

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O3

void __thiscall
highs::RbTree<HighsNodeQueue::SuboptimalNodeRbTree>::insertFixup
          (RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *this,LinkType z)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long x;
  ulong uVar4;
  ulong *puVar5;
  long lVar6;
  long x_00;
  ulong uVar7;
  
  lVar2 = this[2].rootNode[1];
  uVar4 = *(ulong *)(lVar2 + 0x70 + z * 0x90);
  while (uVar4 = uVar4 & 0x7fffffffffffffff, uVar4 != 0) {
    uVar3 = *(ulong *)(uVar4 * 0x90 + -0x20 + lVar2);
    if (-1 < (long)uVar3) break;
    x_00 = uVar4 - 1;
    uVar3 = uVar3 & 0x7fffffffffffffff;
    x = uVar3 - 1;
    lVar1 = *(long *)(uVar3 * 0x90 + -0x30 + lVar2);
    uVar7 = (ulong)(lVar1 == x_00);
    lVar6 = *(long *)(uVar3 * 0x90 + lVar2 + -0x30 + uVar7 * 8);
    if ((lVar6 == -1) || (lVar6 = lVar6 * 0x90, -1 < *(long *)(lVar2 + 0x70 + lVar6))) {
      lVar6 = x_00;
      if (z == *(long *)(lVar2 + x_00 * 0x90 + 0x60 + uVar7 * 8)) {
        rotate(this,x_00,(uint)(lVar1 != x_00));
        lVar2 = this[2].rootNode[1];
        uVar4 = *(ulong *)(lVar2 + 0x70 + x_00 * 0x90) & 0x7fffffffffffffff;
        uVar3 = *(ulong *)(uVar4 * 0x90 + -0x20 + lVar2) & 0x7fffffffffffffff;
        x = uVar3 - 1;
        lVar6 = uVar4 - 1;
        z = x_00;
      }
      *(ulong *)(lVar2 + 0x70 + lVar6 * 0x90) = uVar3;
      puVar5 = (ulong *)(lVar2 + 0x70 + x * 0x90);
      *puVar5 = *puVar5 | 0x8000000000000000;
      rotate(this,x,(uint)(lVar1 == x_00));
      lVar2 = this[2].rootNode[1];
      uVar4 = *(ulong *)(lVar2 + 0x70 + z * 0x90);
    }
    else {
      puVar5 = (ulong *)(lVar2 + lVar6 + 0x70);
      *(ulong *)(uVar4 * 0x90 + lVar2 + -0x20) = uVar3;
      *puVar5 = *puVar5 & 0x7fffffffffffffff;
      uVar4 = *(ulong *)(lVar2 + 0x70 + x * 0x90) | 0x8000000000000000;
      *(ulong *)(lVar2 + 0x70 + x * 0x90) = uVar4;
      z = x;
    }
  }
  puVar5 = (ulong *)(lVar2 + 0x70 + *this->rootNode * 0x90);
  *puVar5 = *puVar5 & 0x7fffffffffffffff;
  return;
}

Assistant:

void insertFixup(LinkType z) {
    LinkType pZ = getParent(z);
    while (isRed(pZ)) {
      LinkType zGrandParent = getParent(pZ);
      assert(zGrandParent != kNoLink);

      Dir dir = Dir(getChild(zGrandParent, kLeft) == pZ);

      LinkType y = getChild(zGrandParent, dir);
      if (isRed(y)) {
        makeBlack(pZ);
        makeBlack(y);
        makeRed(zGrandParent);
        z = zGrandParent;
      } else {
        if (z == getChild(pZ, dir)) {
          z = pZ;
          rotate(z, opposite(dir));
          pZ = getParent(z);
          zGrandParent = getParent(pZ);
          assert(zGrandParent != kNoLink);
        }

        makeBlack(pZ);
        makeRed(zGrandParent);
        rotate(zGrandParent, dir);
      }

      pZ = getParent(z);
    }

    makeBlack(rootNode);
  }